

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliFindLongestMatch
               (ZopfliBlockState *s,ZopfliHash *h,uchar *array,size_t pos,size_t size,size_t limit,
               unsigned_short *sublen,unsigned_short *distance,unsigned_short *length)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uchar *end;
  uchar *safe_end;
  uchar *puVar4;
  ulong in_RCX;
  long in_RDX;
  size_t *in_RSI;
  ulong in_R8;
  ulong in_R9;
  long in_stack_00000008;
  undefined2 *in_stack_00000010;
  unsigned_short j;
  unsigned_short same;
  ushort *in_stack_00000018;
  unsigned_short same1;
  unsigned_short same0;
  unsigned_short currentlength;
  int hval;
  int *hhashval;
  unsigned_short *hprev;
  int *hhead;
  uint dist;
  int chain_counter;
  uchar *arrayend_safe;
  uchar *arrayend;
  uchar *match;
  uchar *scan;
  unsigned_short bestlength;
  unsigned_short bestdist;
  unsigned_short pp;
  unsigned_short p;
  unsigned_short hpos;
  int local_9c;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff72;
  undefined2 in_stack_ffffffffffffff74;
  undefined2 in_stack_ffffffffffffff76;
  undefined2 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7a;
  ushort uVar5;
  int iVar6;
  size_t *limit_00;
  size_t pos_00;
  int iVar7;
  ZopfliBlockState *in_stack_ffffffffffffffb0;
  uchar *local_48;
  ushort local_3a;
  undefined2 local_38;
  ushort local_34;
  ulong local_30;
  
  local_38 = 0;
  local_3a = 1;
  iVar7 = 0x2000;
  pos_00 = *in_RSI;
  limit_00 = (size_t *)in_RSI[1];
  iVar6 = (int)in_RSI[3];
  iVar2 = TryGetFromLongestMatchCache
                    ((ZopfliBlockState *)0x200000000000,pos_00,limit_00,(unsigned_short *)in_RSI[2],
                     (unsigned_short *)
                     CONCAT44(iVar6,CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)),
                     (unsigned_short *)
                     CONCAT26(in_stack_ffffffffffffff76,
                              CONCAT24(in_stack_ffffffffffffff74,
                                       CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)
                                      )));
  if (iVar2 == 0) {
    if (in_R8 - in_RCX < 3) {
      *in_stack_00000018 = 0;
      *in_stack_00000010 = 0;
    }
    else {
      local_30 = in_R9;
      if (in_R8 < in_RCX + in_R9) {
        local_30 = in_R8 - in_RCX;
      }
      end = (uchar *)(in_RDX + in_RCX + local_30);
      safe_end = end + -8;
      uVar3 = *(uint *)(pos_00 + (long)iVar6 * 4);
      local_34 = *(ushort *)((long)limit_00 + (ulong)(ushort)uVar3 * 2);
      if (local_34 < (ushort)uVar3) {
        uVar3 = (uVar3 & 0xffff) - (uint)local_34;
      }
      else {
        uVar3 = (0x8000 - (uint)local_34) + (uVar3 & 0xffff);
      }
      do {
        if (0x7fff < uVar3) break;
        uVar5 = 0;
        if (uVar3 != 0) {
          local_48 = (uchar *)(in_RDX + in_RCX);
          in_stack_ffffffffffffffb0 = (ZopfliBlockState *)(in_RDX + (in_RCX - uVar3));
          if ((in_R8 <= in_RCX + local_3a) ||
             (local_48[(int)(uint)local_3a] ==
              *(uchar *)((long)&in_stack_ffffffffffffffb0->options + (long)(int)(uint)local_3a))) {
            uVar5 = *(ushort *)(in_RSI[8] + (in_RCX & 0x7fff) * 2);
            if ((2 < uVar5) && (*local_48 == *(uchar *)&in_stack_ffffffffffffffb0->options)) {
              uVar1 = *(ushort *)(in_RSI[8] + (in_RCX - uVar3 & 0x7fff) * 2);
              if (uVar5 < uVar1) {
                uVar1 = uVar5;
              }
              if (local_30 < uVar1) {
                uVar1 = (ushort)local_30;
              }
              local_48 = local_48 + (int)(uint)uVar1;
              in_stack_ffffffffffffffb0 =
                   (ZopfliBlockState *)
                   ((long)&in_stack_ffffffffffffffb0->options + (long)(int)(uint)uVar1);
            }
            puVar4 = GetMatch(local_48,(uchar *)in_stack_ffffffffffffffb0,end,safe_end);
            uVar5 = (short)puVar4 - ((short)in_RDX + (ushort)in_RCX);
          }
          if (local_3a < uVar5) {
            local_38 = (undefined2)uVar3;
            if (in_stack_00000008 != 0) {
              while (local_3a = local_3a + 1, local_3a <= uVar5) {
                *(undefined2 *)(in_stack_00000008 + (ulong)local_3a * 2) = local_38;
              }
            }
            local_3a = uVar5;
            if (local_30 <= uVar5) break;
          }
        }
        if (((pos_00 != in_RSI[4]) &&
            (*(ushort *)(in_RSI[8] + (ulong)((ushort)in_RCX & 0x7fff) * 2) <= local_3a)) &&
           ((int)in_RSI[7] == *(int *)(in_RSI[6] + (ulong)local_34 * 4))) {
          pos_00 = in_RSI[4];
          limit_00 = (size_t *)in_RSI[5];
        }
        uVar5 = *(ushort *)((long)limit_00 + (ulong)local_34 * 2);
        if (uVar5 == local_34) break;
        if (uVar5 < local_34) {
          local_9c = (uint)local_34 - (uint)uVar5;
        }
        else {
          local_9c = (0x8000 - (uint)uVar5) + (uint)local_34;
        }
        uVar3 = local_9c + uVar3;
        iVar7 = iVar7 + -1;
        local_34 = uVar5;
      } while (0 < iVar7);
      StoreInLongestMatchCache
                (in_stack_ffffffffffffffb0,(size_t)end,(size_t)safe_end,
                 (unsigned_short *)CONCAT44(iVar7,uVar3),(unsigned_short)(pos_00 >> 0x30),
                 (unsigned_short)(pos_00 >> 0x20));
      *in_stack_00000010 = local_38;
      *in_stack_00000018 = local_3a;
    }
  }
  return;
}

Assistant:

void ZopfliFindLongestMatch(ZopfliBlockState* s, const ZopfliHash* h,
    const unsigned char* array,
    size_t pos, size_t size, size_t limit,
    unsigned short* sublen, unsigned short* distance, unsigned short* length) {
  unsigned short hpos = pos & ZOPFLI_WINDOW_MASK, p, pp;
  unsigned short bestdist = 0;
  unsigned short bestlength = 1;
  const unsigned char* scan;
  const unsigned char* match;
  const unsigned char* arrayend;
  const unsigned char* arrayend_safe;
#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
  int chain_counter = ZOPFLI_MAX_CHAIN_HITS;  /* For quitting early. */
#endif

  unsigned dist = 0;  /* Not unsigned short on purpose. */

  int* hhead = h->head;
  unsigned short* hprev = h->prev;
  int* hhashval = h->hashval;
  int hval = h->val;

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  if (TryGetFromLongestMatchCache(s, pos, &limit, sublen, distance, length)) {
    assert(pos + *length <= size);
    return;
  }
#endif

  assert(limit <= ZOPFLI_MAX_MATCH);
  assert(limit >= ZOPFLI_MIN_MATCH);
  assert(pos < size);

  if (size - pos < ZOPFLI_MIN_MATCH) {
    /* The rest of the code assumes there are at least ZOPFLI_MIN_MATCH bytes to
       try. */
    *length = 0;
    *distance = 0;
    return;
  }

  if (pos + limit > size) {
    limit = size - pos;
  }
  arrayend = &array[pos] + limit;
  arrayend_safe = arrayend - 8;

  assert(hval < 65536);

  pp = hhead[hval];  /* During the whole loop, p == hprev[pp]. */
  p = hprev[pp];

  assert(pp == hpos);

  dist = p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

  /* Go through all distances. */
  while (dist < ZOPFLI_WINDOW_SIZE) {
    unsigned short currentlength = 0;

    assert(p < ZOPFLI_WINDOW_SIZE);
    assert(p == hprev[pp]);
    assert(hhashval[p] == hval);

    if (dist > 0) {
      assert(pos < size);
      assert(dist <= pos);
      scan = &array[pos];
      match = &array[pos - dist];

      /* Testing the byte at position bestlength first, goes slightly faster. */
      if (pos + bestlength >= size
          || *(scan + bestlength) == *(match + bestlength)) {

#ifdef ZOPFLI_HASH_SAME
        unsigned short same0 = h->same[pos & ZOPFLI_WINDOW_MASK];
        if (same0 > 2 && *scan == *match) {
          unsigned short same1 = h->same[(pos - dist) & ZOPFLI_WINDOW_MASK];
          unsigned short same = same0 < same1 ? same0 : same1;
          if (same > limit) same = limit;
          scan += same;
          match += same;
        }
#endif
        scan = GetMatch(scan, match, arrayend, arrayend_safe);
        currentlength = scan - &array[pos];  /* The found length. */
      }

      if (currentlength > bestlength) {
        if (sublen) {
          unsigned short j;
          for (j = bestlength + 1; j <= currentlength; j++) {
            sublen[j] = dist;
          }
        }
        bestdist = dist;
        bestlength = currentlength;
        if (currentlength >= limit) break;
      }
    }


#ifdef ZOPFLI_HASH_SAME_HASH
    /* Switch to the other hash once this will be more efficient. */
    if (hhead != h->head2 && bestlength >= h->same[hpos] &&
        h->val2 == h->hashval2[p]) {
      /* Now use the hash that encodes the length and first byte. */
      hhead = h->head2;
      hprev = h->prev2;
      hhashval = h->hashval2;
      hval = h->val2;
    }
#endif

    pp = p;
    p = hprev[p];
    if (p == pp) break;  /* Uninited prev value. */

    dist += p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
    chain_counter--;
    if (chain_counter <= 0) break;
#endif
  }

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  StoreInLongestMatchCache(s, pos, limit, sublen, bestdist, bestlength);
#endif

  assert(bestlength <= limit);

  *distance = bestdist;
  *length = bestlength;
  assert(pos + *length <= size);
}